

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase::
Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>::~Node
          (Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *this)

{
  ~Node(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

virtual ~Node() {}